

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::emulate_mthd(MthdEmuD3D56TlvUv *this)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  int ovidx;
  uint32_t msk;
  int vidx;
  MthdEmuD3D56TlvUv *this_local;
  
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.chipset != 0x10) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
      [(this->which_vtx + 3) * 4 + 1] = 0;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
    [(this->which_vtx + 3) * 4 + 2] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
    [(this->which_vtx + 3) * 4 + 3] = 0x3f800000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_vtx
    [(this->which_vtx + 3) * 4 + this->which_uv] = (this->super_SingleMthdTest).super_MthdTest.val;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc24[2] & 0xf;
  }
  else {
    uVar1 = *(uint *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914;
  }
  if ((this->which_uv == 0) || (this->which_vtx == 0)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] &
         ((uint)(1L << ((char)this->which_vtx * '\x02' + '\x06' + (char)this->which_uv & 0x3fU)) ^
         0xffffffff) |
         (uint)(1L << ((char)this->which_vtx * '\x02' + '\x06' + (char)this->which_uv & 0x3fU));
  }
  bVar2 = (byte)uVar1;
  if ((this->fin & 1U) == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] &
         ((uint)(1L << (bVar2 & 0x3f)) ^ 0xffffffff) | (uint)(0L << (bVar2 & 0x3f));
  }
  else {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
    bVar4 = true;
    if ((this->super_SingleMthdTest).super_MthdTest.cls != 0x55) {
      bVar4 = (this->super_SingleMthdTest).super_MthdTest.cls == 0x95;
    }
    uVar3 = 0x7f;
    if (bVar4) {
      uVar3 = 0x1ff;
    }
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & uVar3) == uVar3)
    {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] &
           ((uint)(1L << (bVar2 & 0x3f)) ^ 0xffffffff) | (uint)(1L << (bVar2 & 0x3f));
      if ((this->super_SingleMthdTest).super_MthdTest.cls != 0x48) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xfff0ffff |
             (uVar1 & 0xf) << 0x10;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
           (uVar3 ^ 0xffffffff) &
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1];
    }
    else if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                valid[0] <<
                        (0x3f - (byte)(((ulong)(this->super_SingleMthdTest).super_MthdTest.
                                               super_StateTest.exp.valid[0] << 0x2c) >> 0x3c) & 0x3f
                        ))) {
      nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x4000);
    }
    if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
    }
    if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.surf_format << 0x34
         ) >> 0x3c == 0) &&
       ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d <<
              0x29) < 0)) {
      nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x200);
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			if (chipset.chipset != 0x10)
				exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + 1] = 0;
			exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + 2] = 0;
			exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + 3] = 0x3f800000;
			exp.celsius_pipe_vtx[(3 + which_vtx) * 4 + which_uv] = val;
		}
		int vidx = (cls == 0x48 ? extr(exp.misc24[2], 0, 4) : idx);
		if (!which_uv || !which_vtx)
			insrt(exp.valid[1], 6 + which_vtx * 2 + which_uv, 1, 1);
		if (fin) {
			// XXX: test this thing
			skip = true;
			uint32_t msk = (cls == 0x55 || cls == 0x95 ? 0x1ff : 0x7f);
			int ovidx = extr(exp.valid[0], 16, 4);
			if ((exp.valid[1] & msk) == msk) {
				insrt(exp.valid[0], vidx, 1, 1);
				if (cls != 0x48)
					insrt(exp.valid[0], 16, 4, vidx);
				exp.valid[1] &= ~msk;
			} else if (!extr(exp.valid[0], ovidx, 1)) {
				nv04_pgraph_blowup(&exp, 0x4000);
			}
			// sounds buggy...
			if (extr(exp.debug_d, 5, 1) && cls != 0x48)
				vidx = extr(exp.valid[0], 16, 4);
			if (cls == 0x55) {
				vidx &= 7;
				// ...
			} else {
				// ...
			}
			if (cls == 0x48) {
				// XXX
				skip = true;
			}
			if (!extr(exp.surf_format, 8, 4) && extr(exp.debug_d, 22, 1))
				nv04_pgraph_blowup(&exp, 0x0200);
		} else {
			insrt(exp.valid[0], vidx, 1, 0);
		}
	}